

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O2

int __thiscall DIS::RecordSpecification::getMarshalledSize(RecordSpecification *this)

{
  pointer pRVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  RecordSpecificationElement listElement;
  
  iVar4 = 4;
  lVar6 = 8;
  uVar5 = 0;
  while( true ) {
    pRVar1 = (this->_recordSets).
             super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_recordSets).
                       super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x18) <= uVar5)
    break;
    listElement._vptr_RecordSpecificationElement =
         (_func_int **)&PTR__RecordSpecificationElement_001c2b30;
    uVar2 = *(undefined8 *)((long)&pRVar1->_vptr_RecordSpecificationElement + lVar6);
    listElement._16_7_ =
         SUB87((ulong)*(undefined8 *)((long)&pRVar1->_vptr_RecordSpecificationElement + lVar6 + 7)
               >> 8,0);
    listElement._8_7_ = SUB87(uVar2,0);
    listElement._recordSetSerialNumber._3_1_ = (undefined1)((ulong)uVar2 >> 0x38);
    iVar3 = RecordSpecificationElement::getMarshalledSize(&listElement);
    iVar4 = iVar4 + iVar3;
    RecordSpecificationElement::~RecordSpecificationElement(&listElement);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x18;
  }
  return iVar4;
}

Assistant:

int RecordSpecification::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _numberOfRecordSets

   for(unsigned long long idx=0; idx < _recordSets.size(); idx++)
   {
        RecordSpecificationElement listElement = _recordSets[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}